

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_stream_data_blocked_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  quicly_stream_t *pqVar2;
  quicly_conn_t *in_RDI;
  int ret;
  quicly_stream_t *stream;
  quicly_stream_data_blocked_frame_t frame;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint8_t *in_stack_ffffffffffffffd0;
  quicly_conn_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = quicly_decode_stream_data_blocked_frame
                      ((uint8_t **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (quicly_stream_data_blocked_frame_t *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (local_4 == 0) {
    quicly_is_client(in_RDI);
    iVar1 = quicly_stream_has_receive_side
                      ((int)in_stack_ffffffffffffffd0,CONCAT44(local_4,in_stack_ffffffffffffffc8));
    if (iVar1 == 0) {
      local_4 = 0x20007;
    }
    else {
      pqVar2 = quicly_get_stream(in_stack_ffffffffffffffd8,
                                 (quicly_stream_id_t)in_stack_ffffffffffffffd0);
      if (pqVar2 != (quicly_stream_t *)0x0) {
        quicly_maxsender_request_transmit(&(pqVar2->_send_aux).max_stream_data_sender);
        iVar1 = should_send_max_stream_data
                          ((quicly_stream_t *)CONCAT44(local_4,in_stack_ffffffffffffffc8));
        if (iVar1 != 0) {
          sched_stream_control((quicly_stream_t *)0x156c96);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int handle_stream_data_blocked_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stream_data_blocked_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_stream_data_blocked_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(STREAM_DATA_BLOCKED_RECEIVE, conn, conn->stash.now, frame.stream_id, frame.offset);

    if (!quicly_stream_has_receive_side(quicly_is_client(conn), frame.stream_id))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((stream = quicly_get_stream(conn, frame.stream_id)) != NULL) {
        quicly_maxsender_request_transmit(&stream->_send_aux.max_stream_data_sender);
        if (should_send_max_stream_data(stream))
            sched_stream_control(stream);
    }

    return 0;
}